

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::Constraint::setLowerBound(Constraint *this,VectorDynSize *lowerBound)

{
  long lVar1;
  VectorDynSize *in_RSI;
  long in_RDI;
  bool bVar2;
  
  lVar1 = iDynTree::VectorDynSize::size();
  bVar2 = lVar1 == *(long *)(in_RDI + 8);
  if (bVar2) {
    iDynTree::VectorDynSize::operator=((VectorDynSize *)(in_RDI + 0x50),in_RSI);
    *(undefined1 *)(in_RDI + 0x90) = 1;
  }
  else {
    iDynTree::reportError
              ("Constraint","setLowerBound",
               "The lowerBound dimension is not coherent with the constraint size.");
  }
  return bVar2;
}

Assistant:

bool Constraint::setLowerBound(const VectorDynSize &lowerBound)
        {
            if (lowerBound.size() != m_constraintSize){
                reportError("Constraint", "setLowerBound", "The lowerBound dimension is not coherent with the constraint size.");
                return false;
            }
            m_lowerBound = lowerBound;
            m_isLowerBounded = true;
            return true;
        }